

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdMultiply(EpDouble *epd1,double value)

{
  EpTypeUnion EVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  undefined4 in_R11D;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = value;
  if ((SUB84(epd1->type,4) >> 0x14 < 0xfff ||
       ((ulong)epd1->type & 0xfffffffffffff) != 0x8000000000000) &&
     (((ulong)value & 0xfffffffffffff) != 0x8000000000000 || (ulong)value < 0xfff0000000000000)) {
    if ((ABS(value) != INFINITY) && (((ulong)epd1->type & 0x7fffffffffffffff) != 0x7ff0000000000000)
       ) {
      if (((ulong)epd1->type & 0x7ff0000000000000) == 0x3ff0000000000000) {
        iVar4 = 0;
        if ((((ulong)value & 0x7ff7ffffffffffff) != 0x7ff0000000000000 ||
             ((ulong)value & 0x8008000000000000) == 0x8000000000000) &&
           (uVar3 = (uint)((ulong)value >> 0x34) & 0x7ff, uVar3 != 0x3ff)) {
          iVar4 = uVar3 - 0x3ff;
          value = (double)((ulong)value & 0x800fffffffffffff | 0x3ff0000000000000);
        }
        (epd1->type).value = value * (epd1->type).value;
        epd1->exponent = epd1->exponent + iVar4;
        EpdNormalize(epd1);
        return;
      }
      __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                    ,0xdf,"void EpdMultiply(EpDouble *, double)");
    }
    uVar3 = movmskpd(in_R11D,auVar5);
    dVar2 = value;
    if (((ulong)value & 0x8008000000000000) != 0x8000000000000) {
      dVar2 = (double)((ulong)uVar3 << 0x3f);
    }
    if (((ulong)value & 0x7ff7ffffffffffff) != 0x7ff0000000000000) {
      dVar2 = value;
    }
    if (((ulong)value & 0x7ff0000000000000) == 0x3ff0000000000000) {
      dVar2 = (double)((ulong)uVar3 << 0x3f);
    }
    EVar1 = (EpTypeUnion)
            (((ulong)dVar2 ^ (ulong)epd1->type) & 0x8000000000000000 | 0x7ff0000000000000);
  }
  else {
    EVar1.value = -NAN;
  }
  epd1->type = EVar1;
  epd1->exponent = 0;
  return;
}

Assistant:

void
EpdMultiply(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
    EpdMakeInf(epd1, sign);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  tmp = epd1->type.value * epd2.type.value;
  exponent = epd1->exponent + epd2.exponent;
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}